

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

bool __thiscall libebml::EbmlMaster::CheckMandatory(EbmlMaster *this)

{
  bool bVar1;
  EbmlSemanticContext *pEVar2;
  EbmlElement *pEVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (this->Context->Size == 0) {
    __assert_fail("Context.GetSize() != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlMaster.cpp"
                  ,0xc9,"bool libebml::EbmlMaster::CheckMandatory() const");
  }
  pEVar2 = this->Context;
  bVar6 = pEVar2->Size == 0;
  if (!bVar6) {
    uVar4 = 1;
    uVar5 = 0;
    do {
      if ((pEVar2->MyTable[uVar5].Mandatory == true) &&
         (pEVar3 = FindElt(this,pEVar2->MyTable[uVar5].GetCallbacks), pEVar3 == (EbmlElement *)0x0))
      {
        pEVar3 = (*(this->Context->MyTable[uVar5].GetCallbacks)->Create)();
        bVar1 = pEVar3->DefaultIsSet;
        (*pEVar3->_vptr_EbmlElement[1])(pEVar3);
        if (bVar1 != true) {
          return bVar6;
        }
      }
      uVar5 = (ulong)uVar4;
      pEVar2 = this->Context;
      uVar4 = uVar4 + 1;
      bVar6 = pEVar2->Size <= uVar5;
    } while (uVar5 < pEVar2->Size);
  }
  return bVar6;
}

Assistant:

bool EbmlMaster::CheckMandatory() const
{
  assert(Context.GetSize() != 0);

  unsigned int EltIdx;
  for (EltIdx = 0; EltIdx < EBML_CTX_SIZE(Context); EltIdx++) {
    if (EBML_CTX_IDX(Context,EltIdx).IsMandatory()) {
      if (FindElt(EBML_CTX_IDX_INFO(Context,EltIdx)) == NULL) {
        EbmlElement *testElement = &EBML_CTX_IDX(Context,EltIdx).Create();
        bool hasDefaultValue     = testElement->DefaultISset();
        delete testElement;

#if defined(LIBEBML_DEBUG)
        // you are missing this Mandatory element
//         const char * MissingName = EBML_INFO_NAME(EBML_CTX_IDX_INFO(Context,EltIdx));
#endif // LIBEBML_DEBUG
        if (!hasDefaultValue)
          return false;
      }
    }
  }

  return true;
}